

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.cpp
# Opt level: O0

void duckdb_brotli::BrotliDecoderDestroyInstance(BrotliDecoderStateInternal *state)

{
  code *pcVar1;
  undefined8 uVar2;
  long in_RDI;
  void *opaque;
  brotli_free_func free_func;
  
  if (in_RDI != 0) {
    pcVar1 = *(code **)(in_RDI + 0x38);
    uVar2 = *(undefined8 *)(in_RDI + 0x40);
    BrotliDecoderStateCleanup((BrotliDecoderStateInternal *)0x82b328);
    (*pcVar1)(uVar2,in_RDI);
  }
  return;
}

Assistant:

void BrotliDecoderDestroyInstance(BrotliDecoderState *state) {
	if (!state) {
		return;
	} else {
		brotli_free_func free_func = state->free_func;
		void *opaque = state->memory_manager_opaque;
		BrotliDecoderStateCleanup(state);
		free_func(opaque, state);
	}
}